

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross.cpp
# Opt level: O2

SPIRType * __thiscall
spirv_cross::Compiler::get_variable_element_type(Compiler *this,SPIRVariable *var)

{
  SPIRType *pSVar1;
  
  pSVar1 = get_variable_data_type(this,var);
  if ((*(uint *)&(pSVar1->super_IVariant).field_0xc & 0xfffffffe) == 0x1c) {
    pSVar1 = get<spirv_cross::SPIRType>(this,(pSVar1->parent_type).id);
    return pSVar1;
  }
  return pSVar1;
}

Assistant:

SPIRType &Compiler::get_variable_element_type(const SPIRVariable &var)
{
	SPIRType *type = &get_variable_data_type(var);
	if (is_array(*type))
		type = &get<SPIRType>(type->parent_type);
	return *type;
}